

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmmath.c
# Opt level: O0

double lj_vm_foldarith(double x,double y,int op)

{
  undefined4 in_EDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc0;
  double local_38;
  double local_8;
  
  local_38 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_8 = in_XMM0_Qa;
  switch(in_EDI) {
  case 0:
    local_8 = in_XMM0_Qa + local_38;
    break;
  case 1:
    local_8 = in_XMM0_Qa - local_38;
    break;
  case 2:
    local_8 = in_XMM0_Qa * local_38;
    break;
  case 3:
    local_8 = in_XMM0_Qa / local_38;
    break;
  case 4:
    local_8 = lj_vm_floormul(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_8 = in_XMM0_Qa - local_8;
    break;
  case 5:
    local_8 = pow(in_XMM0_Qa,local_38);
    break;
  case 6:
    local_8 = -in_XMM0_Qa;
    break;
  case 7:
    local_8 = ABS(in_XMM0_Qa);
    break;
  case 8:
    local_8 = ldexp(in_XMM0_Qa,(int)local_38);
    break;
  case 9:
    if (in_XMM0_Qa < local_38) {
      local_38 = in_XMM0_Qa;
    }
    local_8 = local_38;
    break;
  case 10:
    local_8 = local_38;
    if (local_38 < in_XMM0_Qa) {
      local_8 = in_XMM0_Qa;
    }
  }
  return local_8;
}

Assistant:

double lj_vm_foldarith(double x, double y, int op)
{
  switch (op) {
  case IR_ADD - IR_ADD: return x+y; break;
  case IR_SUB - IR_ADD: return x-y; break;
  case IR_MUL - IR_ADD: return x*y; break;
  case IR_DIV - IR_ADD: return x/y; break;
  case IR_MOD - IR_ADD: return x-lj_vm_floormul(x, y); break;
  case IR_POW - IR_ADD: return pow(x, y); break;
  case IR_NEG - IR_ADD: return -x; break;
  case IR_ABS - IR_ADD: return fabs(x); break;
#if LJ_HASJIT
  case IR_LDEXP - IR_ADD: return ldexp(x, (int)y); break;
  case IR_MIN - IR_ADD: return x < y ? x : y; break;
  case IR_MAX - IR_ADD: return x > y ? x : y; break;
#endif
  default: return x;
  }
}